

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLLoader.cpp
# Opt level: O3

void __thiscall
Assimp::MDLImporter::InternReadFile
          (MDLImporter *this,string *pFile,aiScene *_pScene,IOSystem *_pIOHandler)

{
  aiNode *paVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  uchar *puVar4;
  Logger *pLVar5;
  MDLImporter *this_00;
  long *extraout_RAX;
  runtime_error *prVar6;
  long *plVar7;
  long *plVar8;
  size_type *psVar9;
  long *extraout_RDX;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this->pScene = _pScene;
  this->pIOHandler = _pIOHandler;
  local_d0 = &local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"rb","");
  iVar2 = (*_pIOHandler->_vptr_IOSystem[4])(_pIOHandler,(pFile->_M_dataplus)._M_p,local_d0);
  prVar6 = (runtime_error *)CONCAT44(extraout_var,iVar2);
  if (local_d0 != &local_c0) {
    operator_delete(local_d0);
  }
  if (prVar6 == (runtime_error *)0x0) {
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_90,"Failed to open MDL file ",pFile);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_d0 = (long *)*plVar7;
    plVar8 = plVar7 + 2;
    if (local_d0 == plVar8) {
      local_c0 = *plVar8;
      lStack_b8 = plVar7[3];
      local_d0 = &local_c0;
      goto LAB_00437178;
    }
LAB_0043716b:
    local_c0 = *plVar8;
LAB_00437178:
    local_c8 = plVar7[1];
    *plVar7 = (long)plVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::runtime_error::runtime_error(prVar6,(string *)&local_d0);
    *(undefined ***)prVar6 = &PTR__runtime_error_008dc448;
    __cxa_throw(prVar6,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar3 = (**(code **)(*(long *)prVar6 + 0x30))(prVar6);
  this->iFileSize = uVar3;
  if ((uVar3 & 0xfffffffc) < 0x54) {
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_d0 = &local_c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"MDL File is too small.","")
    ;
    std::runtime_error::runtime_error(prVar6,(string *)&local_d0);
    *(undefined ***)prVar6 = &PTR__runtime_error_008dc448;
    __cxa_throw(prVar6,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  puVar4 = (uchar *)operator_new__((ulong)(uVar3 + 1));
  this->mBuffer = puVar4;
  (**(code **)(*(long *)prVar6 + 0x10))(prVar6,puVar4,1,uVar3);
  plVar8 = (long *)(ulong)this->iFileSize;
  this->mBuffer[(long)plVar8] = '\0';
  iVar2 = *(int *)this->mBuffer;
  if (iVar2 < 0x4d444c32) {
    if (0x354c444c < iVar2) {
      if (iVar2 < 0x4944504f) {
        if (iVar2 != 0x354c444d) {
          if (iVar2 != 0x374c444d) goto switchD_00436ec6_caseD_4d444c36;
          goto switchD_00436ec6_caseD_4d444c37;
        }
        goto switchD_00436ec6_caseD_4d444c35;
      }
      if (iVar2 != 0x4944504f) {
        if ((iVar2 != 0x49445351) && (iVar2 != 0x49445354)) goto switchD_00436ec6_caseD_4d444c36;
        goto LAB_00437147;
      }
      goto LAB_00436fc6;
    }
    if (iVar2 != 0x324c444d) {
      if (iVar2 != 0x334c444d) {
        if (iVar2 != 0x344c444d) goto switchD_00436ec6_caseD_4d444c36;
        goto switchD_00436ec6_caseD_4d444c34;
      }
      goto switchD_00436ec6_caseD_4d444c33;
    }
switchD_00436ec6_caseD_4d444c32:
    pLVar5 = DefaultLogger::get();
    uVar3 = 2;
    Logger::debug(pLVar5,"MDL subtype: 3D GameStudio A2, magic word is MDL2");
  }
  else {
    if (iVar2 < 0x4f504449) {
      switch(iVar2) {
      case 0x4d444c32:
        goto switchD_00436ec6_caseD_4d444c32;
      case 0x4d444c33:
switchD_00436ec6_caseD_4d444c33:
        pLVar5 = DefaultLogger::get();
        uVar3 = 3;
        Logger::debug(pLVar5,"MDL subtype: 3D GameStudio A4, magic word is MDL3");
        break;
      case 0x4d444c34:
switchD_00436ec6_caseD_4d444c34:
        pLVar5 = DefaultLogger::get();
        uVar3 = 4;
        Logger::debug(pLVar5,"MDL subtype: 3D GameStudio A4, magic word is MDL4");
        break;
      case 0x4d444c35:
switchD_00436ec6_caseD_4d444c35:
        pLVar5 = DefaultLogger::get();
        uVar3 = 5;
        Logger::debug(pLVar5,"MDL subtype: 3D GameStudio A5, magic word is MDL5");
        break;
      default:
switchD_00436ec6_caseD_4d444c36:
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::operator+(&local_70,"Unknown MDL subformat ",pFile);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_70);
        local_b0._M_dataplus._M_p = (pointer)*plVar7;
        psVar9 = (size_type *)(plVar7 + 2);
        if ((size_type *)local_b0._M_dataplus._M_p == psVar9) {
          local_b0.field_2._M_allocated_capacity = *psVar9;
          local_b0.field_2._8_8_ = plVar7[3];
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        }
        else {
          local_b0.field_2._M_allocated_capacity = *psVar9;
        }
        local_b0._M_string_length = plVar7[1];
        *plVar7 = (long)psVar9;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        local_50._M_string_length = 4;
        local_50.field_2._M_local_buf[4] = '\0';
        local_50.field_2._M_allocated_capacity._0_4_ = iVar2;
        std::operator+(&local_90,&local_b0,&local_50);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_90);
        local_d0 = (long *)*plVar7;
        plVar8 = plVar7 + 2;
        if (local_d0 == plVar8) {
          local_c0 = *plVar8;
          lStack_b8 = plVar7[3];
          local_d0 = &local_c0;
        }
        else {
          local_c0 = *plVar8;
        }
        local_c8 = plVar7[1];
        *plVar7 = (long)plVar8;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        std::runtime_error::runtime_error(prVar6,(string *)&local_d0);
        *(undefined ***)prVar6 = &PTR__runtime_error_008dc448;
        __cxa_throw(prVar6,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      case 0x4d444c37:
switchD_00436ec6_caseD_4d444c37:
        pLVar5 = DefaultLogger::get();
        Logger::debug(pLVar5,"MDL subtype: 3D GameStudio A7, magic word is MDL7");
        this->iGSFileVersion = 7;
        InternReadFile_3DGS_MDL7(this);
        goto LAB_00436feb;
      }
      this->iGSFileVersion = uVar3;
      InternReadFile_3DGS_MDL345(this);
      goto LAB_00436feb;
    }
    if (iVar2 != 0x4f504449) {
      if ((iVar2 != 0x51534449) && (iVar2 != 0x54534449)) goto switchD_00436ec6_caseD_4d444c36;
LAB_00437147:
      this_00 = (MDLImporter *)DefaultLogger::get();
      Logger::debug((Logger *)this_00,"MDL subtype: Source(tm) Engine, magic word is IDST/IDSQ");
      this->iGSFileVersion = 0;
      InternReadFile_HL2(this_00);
      plVar7 = extraout_RAX;
      local_d0 = extraout_RDX;
      goto LAB_0043716b;
    }
LAB_00436fc6:
    pLVar5 = DefaultLogger::get();
    uVar3 = 0;
    Logger::debug(pLVar5,"MDL subtype: Quake 1, magic word is IDPO");
  }
  this->iGSFileVersion = uVar3;
  InternReadFile_Quake1(this);
LAB_00436feb:
  paVar1 = this->pScene->mRootNode;
  (paVar1->mTransformation).a1 = 1.0;
  (paVar1->mTransformation).a2 = 0.0;
  (paVar1->mTransformation).a3 = 0.0;
  (paVar1->mTransformation).a4 = 0.0;
  (paVar1->mTransformation).b1 = 0.0;
  (paVar1->mTransformation).b2 = 0.0;
  (paVar1->mTransformation).b3 = 1.0;
  (paVar1->mTransformation).b4 = 0.0;
  (paVar1->mTransformation).c1 = 0.0;
  (paVar1->mTransformation).c2 = -1.0;
  (paVar1->mTransformation).c3 = 0.0;
  (paVar1->mTransformation).c4 = 0.0;
  (paVar1->mTransformation).d1 = 0.0;
  (paVar1->mTransformation).d2 = 0.0;
  (paVar1->mTransformation).d3 = 0.0;
  (paVar1->mTransformation).d4 = 1.0;
  if (this->mBuffer != (uchar *)0x0) {
    operator_delete__(this->mBuffer);
  }
  this->mBuffer = (uchar *)0x0;
  this->pIOHandler = (IOSystem *)0x0;
  this->pScene = (aiScene *)0x0;
  (**(code **)(*(long *)prVar6 + 8))(prVar6);
  return;
}

Assistant:

void MDLImporter::InternReadFile( const std::string& pFile,
    aiScene* _pScene, IOSystem* _pIOHandler)
{
    pScene     = _pScene;
    pIOHandler = _pIOHandler;
    std::unique_ptr<IOStream> file( pIOHandler->Open( pFile));

    // Check whether we can read from the file
    if( file.get() == NULL) {
        throw DeadlyImportError( "Failed to open MDL file " + pFile + ".");
    }

    // This should work for all other types of MDL files, too ...
    // the quake header is one of the smallest, afaik
    iFileSize = (unsigned int)file->FileSize();
    if( iFileSize < sizeof(MDL::Header)) {
        throw DeadlyImportError( "MDL File is too small.");
    }

    // Allocate storage and copy the contents of the file to a memory buffer
    mBuffer =new unsigned char[iFileSize+1];
    file->Read( (void*)mBuffer, 1, iFileSize);

    // Append a binary zero to the end of the buffer.
    // this is just for safety that string parsing routines
    // find the end of the buffer ...
    mBuffer[iFileSize] = '\0';
    const uint32_t iMagicWord = *((uint32_t*)mBuffer);

    // Determine the file subtype and call the appropriate member function

    // Original Quake1 format
    if (AI_MDL_MAGIC_NUMBER_BE == iMagicWord || AI_MDL_MAGIC_NUMBER_LE == iMagicWord)   {
        ASSIMP_LOG_DEBUG("MDL subtype: Quake 1, magic word is IDPO");
        iGSFileVersion = 0;
        InternReadFile_Quake1();
    }
    // GameStudio A<old> MDL2 format - used by some test models that come with 3DGS
    else if (AI_MDL_MAGIC_NUMBER_BE_GS3 == iMagicWord || AI_MDL_MAGIC_NUMBER_LE_GS3 == iMagicWord)  {
        ASSIMP_LOG_DEBUG("MDL subtype: 3D GameStudio A2, magic word is MDL2");
        iGSFileVersion = 2;
        InternReadFile_Quake1();
    }
    // GameStudio A4 MDL3 format
    else if (AI_MDL_MAGIC_NUMBER_BE_GS4 == iMagicWord || AI_MDL_MAGIC_NUMBER_LE_GS4 == iMagicWord)  {
        ASSIMP_LOG_DEBUG("MDL subtype: 3D GameStudio A4, magic word is MDL3");
        iGSFileVersion = 3;
        InternReadFile_3DGS_MDL345();
    }
    // GameStudio A5+ MDL4 format
    else if (AI_MDL_MAGIC_NUMBER_BE_GS5a == iMagicWord || AI_MDL_MAGIC_NUMBER_LE_GS5a == iMagicWord)    {
        ASSIMP_LOG_DEBUG("MDL subtype: 3D GameStudio A4, magic word is MDL4");
        iGSFileVersion = 4;
        InternReadFile_3DGS_MDL345();
    }
    // GameStudio A5+ MDL5 format
    else if (AI_MDL_MAGIC_NUMBER_BE_GS5b == iMagicWord || AI_MDL_MAGIC_NUMBER_LE_GS5b == iMagicWord)    {
        ASSIMP_LOG_DEBUG("MDL subtype: 3D GameStudio A5, magic word is MDL5");
        iGSFileVersion = 5;
        InternReadFile_3DGS_MDL345();
    }
    // GameStudio A7 MDL7 format
    else if (AI_MDL_MAGIC_NUMBER_BE_GS7 == iMagicWord || AI_MDL_MAGIC_NUMBER_LE_GS7 == iMagicWord)  {
        ASSIMP_LOG_DEBUG("MDL subtype: 3D GameStudio A7, magic word is MDL7");
        iGSFileVersion = 7;
        InternReadFile_3DGS_MDL7();
    }
    // IDST/IDSQ Format (CS:S/HL^2, etc ...)
    else if (AI_MDL_MAGIC_NUMBER_BE_HL2a == iMagicWord || AI_MDL_MAGIC_NUMBER_LE_HL2a == iMagicWord ||
        AI_MDL_MAGIC_NUMBER_BE_HL2b == iMagicWord || AI_MDL_MAGIC_NUMBER_LE_HL2b == iMagicWord)
    {
        ASSIMP_LOG_DEBUG("MDL subtype: Source(tm) Engine, magic word is IDST/IDSQ");
        iGSFileVersion = 0;
        InternReadFile_HL2();
    }
    else    {
        // print the magic word to the log file
        throw DeadlyImportError( "Unknown MDL subformat " + pFile +
            ". Magic word (" + std::string((char*)&iMagicWord,4) + ") is not known");
    }

    // Now rotate the whole scene 90 degrees around the x axis to convert to internal coordinate system
    pScene->mRootNode->mTransformation = aiMatrix4x4(1.f,0.f,0.f,0.f,
        0.f,0.f,1.f,0.f,0.f,-1.f,0.f,0.f,0.f,0.f,0.f,1.f);

    // delete the file buffer and cleanup
    delete [] mBuffer;
    mBuffer= nullptr;
    AI_DEBUG_INVALIDATE_PTR(pIOHandler);
    AI_DEBUG_INVALIDATE_PTR(pScene);
}